

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

bool __thiscall
crnlib::dxt_hc::compress
          (dxt_hc *this,color_quad_u8 (*blocks) [16],
          vector<crnlib::dxt_hc::endpoint_indices_details> *endpoint_indices,
          vector<crnlib::dxt_hc::selector_indices_details> *selector_indices,
          vector<unsigned_int> *color_endpoints,vector<unsigned_int> *alpha_endpoints,
          vector<unsigned_int> *color_selectors,vector<unsigned_long_long> *alpha_selectors,
          params *p)

{
  vector<crnlib::dxt_hc::endpoint_indices_details> *this_00;
  float fVar1;
  uint16 uVar2;
  dxt_format dVar3;
  uint uVar4;
  task_pool *this_01;
  tile_details *ptVar5;
  color_cluster *pcVar6;
  alpha_cluster *paVar7;
  endpoint_indices_details *peVar8;
  uint i;
  crn_thread_id_t cVar9;
  long lVar10;
  ulong uVar11;
  uint8 uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  code *pObject_method;
  uint i_1;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint i_3;
  float (*pafVar21) [8];
  ulong uVar22;
  vector<unsigned_short> *pvVar23;
  uint level;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  uint *local_178;
  uint local_15c;
  hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  alpha_selectors_map;
  vector<unsigned_short> color_selectors_remap;
  vector<unsigned_short> alpha_endpoints_remap;
  vector<unsigned_short> color_endpoints_remap;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  color_selectors_map;
  insert_result insert_result_3;
  vector<unsigned_short> alpha_selectors_remap;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  alpha_endpoints_map;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  color_endpoints_map;
  
  clear(this);
  bVar24 = (uint)(p->m_format + ~cDXN_YX) < 5;
  this->m_has_etc_color_blocks = bVar24;
  this->m_has_subblocks = (uint)(p->m_format + ~cDXN_YX) < 3;
  bVar25 = true;
  if ((p->m_format != cDXT1) && (p->m_format != cDXT5)) {
    bVar25 = bVar24;
  }
  this->m_has_color_blocks = bVar25;
  dVar3 = p->m_format;
  uVar15 = dVar3 + ~cDXT3;
  if ((uVar15 < 9) && ((0x147U >> (uVar15 & 0x1f) & 1) != 0)) {
    this->m_num_alpha_blocks = *(uint *)(&DAT_00195700 + (ulong)uVar15 * 4);
  }
  else {
    this->m_num_alpha_blocks = (uint)(dVar3 == cDXN_YX) * 2;
    if ((dVar3 != cDXN_YX) && (bVar25 == false)) {
      return false;
    }
  }
  local_178 = &this->m_num_alpha_blocks;
  this->m_blocks = blocks;
  cVar9 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar9;
  this->m_pTask_pool = p->m_pTask_pool;
  memcpy(&this->m_params,p,0x158);
  pafVar21 = this->m_color_derating;
  for (uVar22 = 0; uVar22 < p->m_num_levels; uVar22 = uVar22 + 1) {
    fVar1 = p->m_adaptive_tile_color_psnr_derating;
    fVar28 = fVar1;
    if ((uVar22 != 0) && (0.25 < fVar1)) {
      fVar27 = powf(3.0,(float)(uVar22 & 0xffffffff));
      fVar28 = 0.25;
      if (0.25 <= fVar1 / fVar27) {
        fVar28 = fVar1 / fVar27;
      }
    }
    for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 4) {
      *(float *)((long)*pafVar21 + lVar10) =
           ((float)*(uint *)((long)&DAT_00195600 + lVar10) / 3.0) * fVar28 + 0.0;
    }
    pafVar21 = pafVar21 + 1;
  }
  for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 4) {
    *(float *)((long)this->m_alpha_derating + lVar10) =
         ((float)*(uint *)((long)&DAT_00195600 + lVar10) / 3.0) *
         (this->m_params).m_adaptive_tile_alpha_psnr_derating + 0.0;
  }
  for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
    this->m_uint8_to_float[lVar10] = (float)(int)lVar10 / 255.0;
  }
  uVar16 = (this->m_params).m_num_blocks;
  this->m_num_blocks = uVar16;
  vector<float>::resize(&this->m_block_weights,uVar16,false);
  vector<unsigned_char>::resize(&this->m_block_encodings,this->m_num_blocks,false);
  for (lVar10 = 0x668; lVar10 != 0x698; lVar10 = lVar10 + 0x10) {
    vector<unsigned_long_long>::resize
              ((vector<unsigned_long_long> *)((long)(this->m_color_derating + -1) + 0xc + lVar10),
               this->m_num_blocks,false);
  }
  vector<unsigned_int>::resize(&this->m_tile_indices,this->m_num_blocks,false);
  this_00 = &this->m_endpoint_indices;
  vector<crnlib::dxt_hc::endpoint_indices_details>::resize(this_00,this->m_num_blocks,false);
  vector<crnlib::dxt_hc::selector_indices_details>::resize
            (&this->m_selector_indices,this->m_num_blocks,false);
  vector<crnlib::dxt_hc::tile_details>::resize(&this->m_tiles,this->m_num_blocks,false);
  for (uVar22 = 0; uVar22 < p->m_num_levels; uVar22 = uVar22 + 1) {
    fVar1 = p->m_levels[uVar22].m_weight;
    uVar15 = p->m_levels[uVar22].m_first_block;
    uVar16 = p->m_levels[uVar22].m_num_blocks;
    for (uVar11 = (ulong)uVar15; uVar11 < uVar16 + uVar15; uVar11 = uVar11 + 1) {
      (this->m_block_weights).m_p[uVar11] = fVar1;
    }
  }
  for (uVar15 = 0; this_01 = this->m_pTask_pool, uVar15 <= this_01->m_num_threads;
      uVar15 = uVar15 + 1) {
    pObject_method = determine_tiles_task;
    if (this->m_has_subblocks != false) {
      pObject_method = determine_tiles_task_etc;
    }
    task_pool::queue_object_task<crnlib::dxt_hc,void(crnlib::dxt_hc::*)(unsigned_long_long,void*)>
              (this_01,this,(offset_in_dxt_hc_to_subr)pObject_method,0,(void *)(ulong)uVar15);
  }
  task_pool::join(this_01);
  this->m_num_tiles = 0;
  uVar15 = (this->m_tiles).m_size;
  ptVar5 = (this->m_tiles).m_p;
  uVar16 = 0;
  for (lVar10 = 0; (ulong)uVar15 * 0x48 - lVar10 != 0; lVar10 = lVar10 + 0x48) {
    if (*(int *)((long)(ptVar5->color_endpoint).m_s + lVar10 + -0xc) != 0) {
      uVar16 = uVar16 + 1;
      this->m_num_tiles = uVar16;
    }
  }
  if (this->m_has_color_blocks != false) {
    determine_color_endpoints(this);
  }
  if (*local_178 != 0) {
    determine_alpha_endpoints(this);
  }
  if (this->m_has_color_blocks == true) {
    create_color_selector_codebook(this);
  }
  if (*local_178 != 0) {
    create_alpha_selector_codebook(this);
  }
  vector<unsigned_int>::reserve
            (color_endpoints,(this->m_color_clusters).m_size + color_endpoints->m_size);
  vector<unsigned_short>::vector(&color_endpoints_remap,(this->m_color_clusters).m_size);
  color_endpoints_map.m_values.m_p = (raw_node *)0x0;
  color_endpoints_map.m_values.m_size = 0;
  color_endpoints_map.m_values.m_capacity = 0;
  color_endpoints_map.m_hash_shift = 0x20;
  color_endpoints_map.m_num_valid = 0;
  color_endpoints_map.m_grow_threshold = 0;
  lVar10 = 0x22;
  for (uVar22 = 0; uVar22 < (this->m_color_clusters).m_size; uVar22 = uVar22 + 1) {
    pcVar6 = (this->m_color_clusters).m_p;
    if (*(int *)((long)pcVar6->blocks + lVar10 * 2 + -0xc) != 0) {
      uVar16 = *(uint *)((long)pcVar6->blocks + lVar10 * 2 + -4);
      if (this->m_has_etc_color_blocks == false) {
        uVar16 = dxt1_block::pack_endpoints
                           (uVar16,*(uint *)((long)&pcVar6->blocks[0].m_p + lVar10 * 2));
      }
      color_selectors_map.m_values.m_p =
           (raw_node *)CONCAT44(color_selectors_map.m_values.m_p._4_4_,uVar16);
      alpha_selectors_map.m_values.m_p =
           (raw_node *)CONCAT44(alpha_selectors_map.m_values.m_p._4_4_,color_endpoints->m_size);
      hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
      ::insert((insert_result *)&alpha_endpoints_map,&color_endpoints_map,
               (uint *)&color_selectors_map,(uint *)&alpha_selectors_map);
      if ((char)alpha_endpoints_map.m_hash_shift == '\x01') {
        color_endpoints_remap.m_p[uVar22] = (unsigned_short)color_endpoints->m_size;
        vector<unsigned_int>::push_back(color_endpoints,(uint *)&color_selectors_map);
      }
      else {
        color_endpoints_remap.m_p[uVar22] =
             *(unsigned_short *)
              (*(long *)(alpha_endpoints_map.m_values.m_p)->m_bits + 4 +
              (alpha_endpoints_map.m_values._8_8_ & 0xffffffff) * 0xc);
      }
    }
    lVar10 = lVar10 + 0x2c;
  }
  vector<unsigned_int>::reserve
            (alpha_endpoints,(this->m_alpha_clusters).m_size + alpha_endpoints->m_size);
  vector<unsigned_short>::vector(&alpha_endpoints_remap,(this->m_alpha_clusters).m_size);
  alpha_endpoints_map.m_values.m_p = (raw_node *)0x0;
  alpha_endpoints_map.m_values.m_size = 0;
  alpha_endpoints_map.m_values.m_capacity = 0;
  alpha_endpoints_map.m_hash_shift = 0x20;
  alpha_endpoints_map.m_num_valid = 0;
  alpha_endpoints_map.m_grow_threshold = 0;
  lVar10 = 0x22;
  for (uVar22 = 0; uVar22 < (this->m_alpha_clusters).m_size; uVar22 = uVar22 + 1) {
    paVar7 = (this->m_alpha_clusters).m_p;
    if (*(int *)((long)paVar7->blocks + lVar10 * 2 + -0xc) != 0) {
      uVar16 = dxt5_block::pack_endpoints
                         (*(uint *)((long)paVar7->blocks + lVar10 * 2 + -4),
                          *(uint *)((long)&paVar7->blocks[0].m_p + lVar10 * 2));
      alpha_selectors_map.m_values.m_p =
           (raw_node *)CONCAT44(alpha_selectors_map.m_values.m_p._4_4_,uVar16);
      insert_result_3.first.m_pTable._0_4_ = alpha_endpoints->m_size;
      hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
      ::insert((insert_result *)&color_selectors_map,&alpha_endpoints_map,
               (uint *)&alpha_selectors_map,(uint *)&insert_result_3);
      if ((char)color_selectors_map.m_hash_shift == '\x01') {
        alpha_endpoints_remap.m_p[uVar22] = (unsigned_short)alpha_endpoints->m_size;
        vector<unsigned_int>::push_back(alpha_endpoints,(uint *)&alpha_selectors_map);
      }
      else {
        alpha_endpoints_remap.m_p[uVar22] =
             *(unsigned_short *)
              (*(long *)(color_selectors_map.m_values.m_p)->m_bits + 4 +
              (color_selectors_map.m_values._8_8_ & 0xffffffff) * 0xc);
      }
    }
    lVar10 = lVar10 + 0x48;
  }
  vector<unsigned_int>::reserve
            (color_selectors,(this->m_color_selectors).m_size + color_selectors->m_size);
  vector<unsigned_short>::vector(&color_selectors_remap,(this->m_color_selectors).m_size);
  color_selectors_map.m_values.m_p = (raw_node *)0x0;
  color_selectors_map.m_values.m_size = 0;
  color_selectors_map.m_values.m_capacity = 0;
  color_selectors_map.m_hash_shift = 0x20;
  color_selectors_map.m_num_valid = 0;
  color_selectors_map.m_grow_threshold = 0;
  lVar10 = 0;
  for (uVar22 = 0; uVar22 < (this->m_color_selectors).m_size; uVar22 = uVar22 + 1) {
    if ((this->m_color_selectors_used).m_p[uVar22] == true) {
      insert_result_3.first.m_pTable._0_4_ = color_selectors->m_size;
      hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
      ::insert((insert_result *)&alpha_selectors_map,&color_selectors_map,
               (uint *)((long)(this->m_color_selectors).m_p + lVar10),(uint *)&insert_result_3);
      if ((char)alpha_selectors_map.m_hash_shift == '\x01') {
        color_selectors_remap.m_p[uVar22] = (unsigned_short)color_selectors->m_size;
        vector<unsigned_int>::push_back
                  (color_selectors,(uint *)((long)(this->m_color_selectors).m_p + lVar10));
      }
      else {
        color_selectors_remap.m_p[uVar22] =
             *(unsigned_short *)
              (*(long *)(alpha_selectors_map.m_values.m_p)->m_bits + 4 +
              (alpha_selectors_map.m_values._8_8_ & 0xffffffff) * 0xc);
      }
    }
    lVar10 = lVar10 + 4;
  }
  vector<unsigned_long_long>::reserve
            (alpha_selectors,(this->m_alpha_selectors).m_size + alpha_selectors->m_size);
  vector<unsigned_short>::vector(&alpha_selectors_remap,(this->m_alpha_selectors).m_size);
  alpha_selectors_map.m_values.m_p = (raw_node *)0x0;
  alpha_selectors_map.m_values.m_size = 0;
  alpha_selectors_map.m_values.m_capacity = 0;
  alpha_selectors_map.m_hash_shift = 0x20;
  alpha_selectors_map.m_num_valid = 0;
  alpha_selectors_map.m_grow_threshold = 0;
  lVar10 = 0;
  for (uVar22 = 0; uVar22 < (this->m_alpha_selectors).m_size; uVar22 = uVar22 + 1) {
    if ((this->m_alpha_selectors_used).m_p[uVar22] == true) {
      local_15c = alpha_selectors->m_size;
      hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
      ::insert(&insert_result_3,&alpha_selectors_map,
               (unsigned_long_long *)((long)(this->m_alpha_selectors).m_p + lVar10),&local_15c);
      if (insert_result_3.second == true) {
        alpha_selectors_remap.m_p[uVar22] = (unsigned_short)alpha_selectors->m_size;
        vector<unsigned_long_long>::push_back
                  (alpha_selectors,
                   (unsigned_long_long *)((long)(this->m_alpha_selectors).m_p + lVar10));
      }
      else {
        alpha_selectors_remap.m_p[uVar22] =
             *(unsigned_short *)
              (*(long *)CONCAT44(insert_result_3.first.m_pTable._4_4_,
                                 (uint)insert_result_3.first.m_pTable) + 8 +
              (ulong)insert_result_3.first.m_index * 0x10);
      }
    }
    lVar10 = lVar10 + 8;
  }
  vector<crnlib::dxt_hc::endpoint_indices_details>::resize
            (endpoint_indices,this->m_num_blocks,false);
  vector<crnlib::dxt_hc::selector_indices_details>::resize
            (selector_indices,this->m_num_blocks,false);
  for (uVar22 = 0; uVar22 < p->m_num_levels; uVar22 = uVar22 + 1) {
    uVar15 = p->m_levels[uVar22].m_first_block;
    uVar11 = (ulong)uVar15;
    uVar4 = p->m_levels[uVar22].m_block_width;
    uVar16 = p->m_levels[uVar22].m_num_blocks;
    iVar13 = 0;
    while (uVar19 = (uint)uVar11, uVar19 < uVar16 + uVar15) {
      uVar17 = uVar19 - 1;
      uVar18 = uVar19 - uVar4;
      uVar19 = ~uVar4 + uVar19;
      for (uVar20 = 0; uVar20 != uVar4; uVar20 = uVar20 + 1) {
        bVar25 = uVar20 != 0 || iVar13 != 0;
        bVar24 = this->m_has_subblocks == true && (uVar20 != 0 && iVar13 != 0);
        bVar26 = iVar13 != 0;
        for (uVar14 = (ulong)this->m_has_color_blocks ^ 1; uVar14 < *local_178 + 1;
            uVar14 = uVar14 + 1) {
          pvVar23 = &alpha_endpoints_remap;
          if (uVar14 == 0) {
            pvVar23 = &color_endpoints_remap;
          }
          uVar2 = pvVar23->m_p[this_00->m_p[uVar11].field_0.component[uVar14]];
          peVar8 = endpoint_indices->m_p;
          if (bVar25) {
            bVar25 = uVar2 == peVar8[uVar17].field_0.component[uVar14];
          }
          else {
            bVar25 = false;
          }
          if (bVar26) {
            bVar26 = uVar2 == peVar8[uVar18].field_0.component[uVar14];
          }
          else {
            bVar26 = false;
          }
          if (bVar24) {
            bVar24 = uVar2 == peVar8[uVar19].field_0.component[uVar14];
          }
          else {
            bVar24 = false;
          }
          peVar8[uVar11].field_0.component[uVar14] = uVar2;
          pvVar23 = &alpha_selectors_remap;
          if (uVar14 == 0) {
            pvVar23 = &color_selectors_remap;
          }
          selector_indices->m_p[uVar11].field_0.component[uVar14] =
               pvVar23->m_p[(this->m_selector_indices).m_p[uVar11].field_0.component[uVar14]];
        }
        if ((this->m_has_subblocks == true) && ((uVar11 & 1) != 0)) {
          uVar12 = this_00->m_p[uVar11].reference;
        }
        else {
          uVar12 = '\x01';
          if ((!bVar25) && (uVar12 = bVar24 * '\x03', bVar26)) {
            uVar12 = '\x02';
          }
        }
        endpoint_indices->m_p[uVar11].reference = uVar12;
        uVar11 = (ulong)((int)uVar11 + 1);
        uVar17 = uVar17 + 1;
        uVar18 = uVar18 + 1;
        uVar19 = uVar19 + 1;
      }
      iVar13 = iVar13 + 1;
    }
  }
  this->m_pTask_pool = (task_pool *)0x0;
  hash_map<unsigned_long_long,_unsigned_int,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
  ::~hash_map(&alpha_selectors_map);
  vector<unsigned_short>::~vector(&alpha_selectors_remap);
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  ::~hash_map(&color_selectors_map);
  vector<unsigned_short>::~vector(&color_selectors_remap);
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  ::~hash_map(&alpha_endpoints_map);
  vector<unsigned_short>::~vector(&alpha_endpoints_remap);
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  ::~hash_map(&color_endpoints_map);
  vector<unsigned_short>::~vector(&color_endpoints_remap);
  return true;
}

Assistant:

bool dxt_hc::compress(
    color_quad_u8 (*blocks)[16],
    crnlib::vector<endpoint_indices_details>& endpoint_indices,
    crnlib::vector<selector_indices_details>& selector_indices,
    crnlib::vector<uint32>& color_endpoints,
    crnlib::vector<uint32>& alpha_endpoints,
    crnlib::vector<uint32>& color_selectors,
    crnlib::vector<uint64>& alpha_selectors,
    const params& p
  ) {
  clear();
  m_has_etc_color_blocks = p.m_format == cETC1 || p.m_format == cETC2 || p.m_format == cETC2A || p.m_format == cETC1S || p.m_format == cETC2AS;
  m_has_subblocks = p.m_format == cETC1 || p.m_format == cETC2 || p.m_format == cETC2A;
  m_has_color_blocks = p.m_format == cDXT1 || p.m_format == cDXT5 || m_has_etc_color_blocks;
  m_num_alpha_blocks = p.m_format == cDXT5 || p.m_format == cDXT5A || p.m_format == cETC2A || p.m_format == cETC2AS ? 1 : p.m_format == cDXN_XY || p.m_format == cDXN_YX ? 2 : 0;
  if (!m_has_color_blocks && !m_num_alpha_blocks)
    return false;
  m_blocks = blocks;
  m_main_thread_id = crn_get_current_thread_id();
  m_pTask_pool = p.m_pTask_pool;
  m_params = p;

  uint tile_derating[8] = {0, 1, 1, 2, 2, 2, 2, 3};
  for (uint level = 0; level < p.m_num_levels; level++) {
    float adaptive_tile_color_psnr_derating = p.m_adaptive_tile_color_psnr_derating;
    if (level && adaptive_tile_color_psnr_derating > .25f)
      adaptive_tile_color_psnr_derating = math::maximum(.25f, adaptive_tile_color_psnr_derating / powf(3.0f, static_cast<float>(level)));
    for (uint e = 0; e < 8; e++)
      m_color_derating[level][e] = math::lerp(0.0f, adaptive_tile_color_psnr_derating, tile_derating[e] / 3.0f);
  }
  for (uint e = 0; e < 8; e++)
    m_alpha_derating[e] = math::lerp(0.0f, m_params.m_adaptive_tile_alpha_psnr_derating, tile_derating[e] / 3.0f);
  for (uint i = 0; i < 256; i++)
    m_uint8_to_float[i] = i * 1.0f / 255.0f;

  m_num_blocks = m_params.m_num_blocks;
  m_block_weights.resize(m_num_blocks);
  m_block_encodings.resize(m_num_blocks);
  for (uint c = 0; c < 3; c++)
    m_block_selectors[c].resize(m_num_blocks);
  m_tile_indices.resize(m_num_blocks);
  m_endpoint_indices.resize(m_num_blocks);
  m_selector_indices.resize(m_num_blocks);
  m_tiles.resize(m_num_blocks);

  for (uint level = 0; level < p.m_num_levels; level++) {
    float weight = p.m_levels[level].m_weight;
    for (uint b = p.m_levels[level].m_first_block, bEnd = b + p.m_levels[level].m_num_blocks; b < bEnd; b++)
      m_block_weights[b] = weight;
  }

  for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
    m_pTask_pool->queue_object_task(this, m_has_subblocks ? &dxt_hc::determine_tiles_task_etc : &dxt_hc::determine_tiles_task, i);
  m_pTask_pool->join();

  m_num_tiles = 0;
  for (uint t = 0; t < m_tiles.size(); t++) {
    if (m_tiles[t].pixels.size())
      m_num_tiles++;
  }

  if (m_has_color_blocks)
    determine_color_endpoints();

  if (m_num_alpha_blocks)
    determine_alpha_endpoints();

  if (m_has_color_blocks)
    create_color_selector_codebook();

  if (m_num_alpha_blocks)
    create_alpha_selector_codebook();

  color_endpoints.reserve(color_endpoints.size() + m_color_clusters.size());
  crnlib::vector<uint16> color_endpoints_remap(m_color_clusters.size());
  hash_map<uint32, uint> color_endpoints_map;
  for (uint i = 0; i < m_color_clusters.size(); i++) {
    if (m_color_clusters[i].pixels.size()) {
      uint32 endpoint = m_has_etc_color_blocks ? m_color_clusters[i].first_endpoint :
        dxt1_block::pack_endpoints(m_color_clusters[i].first_endpoint, m_color_clusters[i].second_endpoint);
      hash_map<uint32, uint>::insert_result insert_result = color_endpoints_map.insert(endpoint, color_endpoints.size());
      if (insert_result.second) {
        color_endpoints_remap[i] = color_endpoints.size();
        color_endpoints.push_back(endpoint);
      } else {
        color_endpoints_remap[i] = insert_result.first->second;
      }
    }
  }

  alpha_endpoints.reserve(alpha_endpoints.size() + m_alpha_clusters.size());
  crnlib::vector<uint16> alpha_endpoints_remap(m_alpha_clusters.size());
  hash_map<uint32, uint> alpha_endpoints_map;
  for (uint i = 0; i < m_alpha_clusters.size(); i++) {
    if (m_alpha_clusters[i].pixels.size()) {
      uint32 endpoint = dxt5_block::pack_endpoints(m_alpha_clusters[i].first_endpoint, m_alpha_clusters[i].second_endpoint);
      hash_map<uint32, uint>::insert_result insert_result = alpha_endpoints_map.insert(endpoint, alpha_endpoints.size());
      if (insert_result.second) {
        alpha_endpoints_remap[i] = alpha_endpoints.size();
        alpha_endpoints.push_back(endpoint);
      } else {
        alpha_endpoints_remap[i] = insert_result.first->second;
      }
    }
  }

  color_selectors.reserve(color_selectors.size() + m_color_selectors.size());
  crnlib::vector<uint16> color_selectors_remap(m_color_selectors.size());
  hash_map<uint32, uint> color_selectors_map;
  for (uint i = 0; i < m_color_selectors.size(); i++) {
    if (m_color_selectors_used[i]) {
      hash_map<uint32, uint>::insert_result insert_result = color_selectors_map.insert(m_color_selectors[i], color_selectors.size());
      if (insert_result.second) {
        color_selectors_remap[i] = color_selectors.size();
        color_selectors.push_back(m_color_selectors[i]);
      } else {
        color_selectors_remap[i] = insert_result.first->second;
      }
    }
  }

  alpha_selectors.reserve(alpha_selectors.size() + m_alpha_selectors.size());
  crnlib::vector<uint16> alpha_selectors_remap(m_alpha_selectors.size());
  hash_map<uint64, uint> alpha_selectors_map;
  for (uint i = 0; i < m_alpha_selectors.size(); i++) {
    if (m_alpha_selectors_used[i]) {
      hash_map<uint64, uint>::insert_result insert_result = alpha_selectors_map.insert(m_alpha_selectors[i], alpha_selectors.size());
      if (insert_result.second) {
        alpha_selectors_remap[i] = alpha_selectors.size();
        alpha_selectors.push_back(m_alpha_selectors[i]);
      } else {
        alpha_selectors_remap[i] = insert_result.first->second;
      }
    }
  }

  endpoint_indices.resize(m_num_blocks);
  selector_indices.resize(m_num_blocks);
  for (uint level = 0; level < p.m_num_levels; level++) {
    uint first_block = p.m_levels[level].m_first_block;
    uint end_block = first_block + p.m_levels[level].m_num_blocks;
    uint block_width = p.m_levels[level].m_block_width;
    for (uint by = 0, b = first_block; b < end_block; by++) {
      for (uint bx = 0; bx < block_width; bx++, b++) {
        bool top_match = by != 0;
        bool left_match = top_match || bx;
        bool diag_match = m_has_subblocks && top_match && bx;
        for (uint c = m_has_color_blocks ? 0 : cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++) {
          uint16 endpoint_index = (c ? alpha_endpoints_remap : color_endpoints_remap)[m_endpoint_indices[b].component[c]];
          left_match = left_match && endpoint_index == endpoint_indices[b - 1].component[c];
          top_match = top_match && endpoint_index == endpoint_indices[b - block_width].component[c];
          diag_match = diag_match && endpoint_index == endpoint_indices[b - block_width - 1].component[c];
          endpoint_indices[b].component[c] = endpoint_index;
          uint16 selector_index = (c ? alpha_selectors_remap : color_selectors_remap)[m_selector_indices[b].component[c]];
          selector_indices[b].component[c] = selector_index;
        }
        endpoint_indices[b].reference = m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : left_match ? 1 : top_match ? 2 : diag_match ? 3 : 0;
      }
    }
  }

  m_pTask_pool = NULL;
  return true;
}